

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::ConvertAesRequest,cfd::js::api::json::ConvertAesResponse,cfd::js::api::ConvertAesRequestStruct,cfd::js::api::ConvertAesResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::ConvertAesResponseStruct_(const_cfd::js::api::ConvertAesRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_5a0;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_4e8 [4];
  JsonClassBase<cfd::js::api::json::ConvertAesResponse> local_4c8 [4];
  undefined1 local_4a8 [8];
  ConvertAesResponse res_2;
  undefined1 local_448 [8];
  ConvertAesResponseStruct response;
  ConvertAesRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_e0 [8];
  ConvertAesRequest req;
  function<cfd::js::api::ConvertAesResponseStruct_(const_cfd::js::api::ConvertAesRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req._184_8_ = call_function;
  ConvertAesRequest::ConvertAesRequest((ConvertAesRequest *)local_e0);
  core::JsonClassBase<cfd::js::api::json::ConvertAesRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::ConvertAesRequest> *)local_e0,request_message);
  ConvertAesRequest::ConvertToStruct
            ((ConvertAesRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (ConvertAesRequest *)local_e0);
  std::
  function<cfd::js::api::ConvertAesResponseStruct_(const_cfd::js::api::ConvertAesRequestStruct_&)>::
  operator()((ConvertAesResponseStruct *)local_448,call_function,
             (ConvertAesRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    ConvertAesResponse::ConvertAesResponse((ConvertAesResponse *)local_4a8);
    ConvertAesResponse::ConvertFromStruct
              ((ConvertAesResponse *)local_4a8,(ConvertAesResponseStruct *)local_448);
    core::JsonClassBase<cfd::js::api::json::ConvertAesResponse>::Serialize_abi_cxx11_(local_4c8);
    std::__cxx11::string::operator=((string *)this,(string *)local_4c8);
    std::__cxx11::string::~string((string *)local_4c8);
    ConvertAesResponse::~ConvertAesResponse((ConvertAesResponse *)local_4a8);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_5a0,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_4e8);
    std::__cxx11::string::operator=((string *)this,(string *)local_4e8);
    std::__cxx11::string::~string((string *)local_4e8);
    ErrorResponse::~ErrorResponse(&local_5a0);
  }
  res_2._87_1_ = 1;
  ConvertAesResponseStruct::~ConvertAesResponseStruct((ConvertAesResponseStruct *)local_448);
  ConvertAesRequestStruct::~ConvertAesRequestStruct
            ((ConvertAesRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ConvertAesRequest::~ConvertAesRequest((ConvertAesRequest *)local_e0);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}